

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

void __thiscall
glcts::ViewportArray::DrawTestBase::prepareTextureD32F(DrawTestBase *this,texture *texture)

{
  GLuint i;
  long lVar1;
  GLfloat data [16384];
  undefined4 auStack_10008 [16384];
  
  lVar1 = 0;
  do {
    auStack_10008[lVar1] = 0xbf800000;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x4000);
  Utils::texture::create(texture,0x80,0x80,0x8cac);
  Utils::texture::update(texture,0x80,0x80,0,0x1902,0x1406,auStack_10008);
  return;
}

Assistant:

void DrawTestBase::prepareTextureD32F(Utils::texture& texture)
{
	static const GLuint size = m_width * m_height;
	GLfloat				data[size];

	for (GLuint i = 0; i < size; ++i)
	{
		data[i] = -1.0f;
	}

	texture.create(m_width, m_height, GL_DEPTH_COMPONENT32F);
	texture.update(m_width, m_height, 0 /* depth */, GL_DEPTH_COMPONENT, GL_FLOAT, data);
}